

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O2

EffectStateFactory * getFactoryByType(ALenum type)

{
  EffectStateFactory *pEVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x100) {
      if (type != 0xa000) {
        return (EffectStateFactory *)0x0;
      }
      pEVar1 = ConvolutionStateFactory_getFactory();
      return pEVar1;
    }
    if (*(int *)((long)&(anonymous_namespace)::FactoryList + lVar2) == type) {
LAB_0011c0eb:
      pEVar1 = (EffectStateFactory *)(**(code **)(&UNK_001a8f28 + lVar2))();
      return pEVar1;
    }
    if (*(int *)((long)&DAT_001a8f30 + lVar2) == type) {
      if (lVar2 == 0x100) {
        return (EffectStateFactory *)0x0;
      }
      pEVar1 = (EffectStateFactory *)(**(code **)(&UNK_001a8f38 + lVar2))();
      return pEVar1;
    }
    if (*(int *)((long)&DAT_001a8f40 + lVar2) == type) {
      lVar2 = lVar2 + 0x20;
      goto LAB_0011c0eb;
    }
    if (*(int *)((long)&DAT_001a8f50 + lVar2) == type) {
      lVar2 = lVar2 + 0x30;
      goto LAB_0011c0eb;
    }
    lVar2 = lVar2 + 0x40;
  } while( true );
}

Assistant:

EffectStateFactory *getFactoryByType(ALenum type)
{
    auto iter = std::find_if(std::begin(FactoryList), std::end(FactoryList),
        [type](const FactoryItem &item) noexcept -> bool
        { return item.Type == type; }
    );
    return (iter != std::end(FactoryList)) ? iter->GetFactory() : nullptr;
}